

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

_Bool mi_os_decommit_ex(void *addr,size_t size,_Bool *needs_recommit,size_t stat_size)

{
  uint uVar1;
  size_t in_RAX;
  void *start;
  _Bool _Var2;
  size_t csize;
  size_t local_28;
  
  local_28 = in_RAX;
  _mi_stat_decrease(&_mi_stats_main.committed,stat_size);
  start = mi_os_page_align_area_conservative(addr,size,&local_28);
  _Var2 = true;
  if (local_28 != 0) {
    *needs_recommit = true;
    uVar1 = _mi_prim_decommit(start,local_28,needs_recommit);
    if (uVar1 != 0) {
      _Var2 = false;
      _mi_warning_message("cannot decommit OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n"
                          ,(ulong)uVar1,(ulong)uVar1,start,local_28);
    }
  }
  return _Var2;
}

Assistant:

static bool mi_os_decommit_ex(void* addr, size_t size, bool* needs_recommit, size_t stat_size) {
  mi_assert_internal(needs_recommit!=NULL);
  mi_os_stat_decrease(committed, stat_size);

  // page align
  size_t csize;
  void* start = mi_os_page_align_area_conservative(addr, size, &csize);
  if (csize == 0) return true;

  // decommit
  *needs_recommit = true;
  int err = _mi_prim_decommit(start,csize,needs_recommit);
  if (err != 0) {
    _mi_warning_message("cannot decommit OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n", err, err, start, csize);
  }
  mi_assert_internal(err == 0);
  return (err == 0);
}